

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMinBase.c
# Opt level: O0

int Abc_ObjFaninNumberNew(Vec_Ptr_t *vFanins,Abc_Obj_t *pFanin)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFanin_local;
  Vec_Ptr_t *vFanins_local;
  
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vFanins);
    if (iVar1 <= local_2c) {
      return -1;
    }
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vFanins,local_2c);
    if (pAVar2 == pFanin) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int Abc_ObjFaninNumberNew( Vec_Ptr_t * vFanins, Abc_Obj_t * pFanin )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Abc_Obj_t *, vFanins, pObj, i )
        if ( pObj == pFanin )
            return i;
    return -1;
}